

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int find_lexical_decl(JSContext *ctx,JSFunctionDef *fd,JSAtom name,int scope_idx,
                     BOOL check_catch_var)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  JSGlobalVar *pJVar6;
  
  uVar5 = (ulong)name;
  do {
    iVar4 = (int)uVar5;
    if (iVar4 < 0) {
      if ((((*(int *)&ctx->array_shape == 0) || (*(int *)((long)&ctx->array_shape + 4) != 0)) ||
          (pJVar6 = find_global_var((JSFunctionDef *)ctx,(JSAtom)fd), pJVar6 == (JSGlobalVar *)0x0))
         || (iVar4 = 0x40000000, (pJVar6->field_0x4 & 2) == 0)) {
        iVar4 = -1;
      }
      return iVar4;
    }
    lVar3 = (ctx->promise_ctor).tag;
    lVar1 = lVar3 + uVar5 * 0x10;
    if (*(JSAtom *)(lVar3 + uVar5 * 0x10) == (JSAtom)fd) {
      uVar2 = *(uint *)(lVar1 + 0xc);
      if ((uVar2 & 2) != 0) {
        return iVar4;
      }
      if ((scope_idx != 0) && ((uVar2 & 0x78) == 0x18)) {
        return iVar4;
      }
    }
    uVar5 = (ulong)*(uint *)(lVar1 + 8);
  } while( true );
}

Assistant:

static int find_lexical_decl(JSContext *ctx, JSFunctionDef *fd, JSAtom name,
                             int scope_idx, BOOL check_catch_var)
{
    while (scope_idx >= 0) {
        JSVarDef *vd = &fd->vars[scope_idx];
        if (vd->var_name == name &&
            (vd->is_lexical || (vd->var_kind == JS_VAR_CATCH &&
                                check_catch_var)))
            return scope_idx;
        scope_idx = vd->scope_next;
    }

    if (fd->is_eval && fd->eval_type == JS_EVAL_TYPE_GLOBAL) {
        if (find_lexical_global_var(fd, name))
            return GLOBAL_VAR_OFFSET;
    }
    return -1;
}